

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int writeSuperJournal(Pager *pPager,char *zSuper)

{
  sqlite3_io_methods *psVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  i64 jrnlSize;
  undefined8 local_38;
  
  iVar3 = 0;
  if (zSuper != (char *)0x0) {
    iVar3 = 0;
    if (pPager->journalMode != '\x04') {
      psVar1 = pPager->jfd->pMethods;
      if (psVar1 != (sqlite3_io_methods *)0x0) {
        pPager->setSuper = '\x01';
        cVar2 = *zSuper;
        if (cVar2 == '\0') {
          uVar8 = 0;
          uVar6 = 0;
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 + (int)cVar2;
            cVar2 = zSuper[uVar7 + 1];
            uVar7 = uVar7 + 1;
          } while (cVar2 != '\0');
          uVar8 = uVar7 & 0xffffffff;
        }
        if (pPager->fullSync != '\0') {
          if (pPager->journalOff == 0) {
            lVar4 = 0;
          }
          else {
            lVar4 = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
                    (ulong)pPager->sectorSize;
          }
          pPager->journalOff = lVar4;
        }
        lVar4 = pPager->journalOff;
        uVar5 = pPager->lckPgno;
        local_38._0_4_ =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        local_38._4_4_ = 0;
        iVar3 = (*psVar1->xWrite)(pPager->jfd,&local_38,4,lVar4);
        if (iVar3 == 0) {
          lVar4 = lVar4 + 4;
          uVar5 = (uint)uVar8;
          iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,zSuper,uVar5,lVar4);
          if (iVar3 == 0) {
            lVar4 = lVar4 + uVar7;
            local_38._0_4_ =
                 uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_38,4,lVar4);
            if (iVar3 == 0) {
              local_38 = CONCAT44(local_38._4_4_,
                                  uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                                  uVar6 << 0x18);
              iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_38,4,lVar4 + 4);
              if ((iVar3 == 0) &&
                 (iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,aJournalMagic,8,lVar4 + 8),
                 iVar3 == 0)) {
                pPager->journalOff = uVar8 + pPager->journalOff + 0x14;
                iVar3 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&local_38);
                if (iVar3 == 0) {
                  iVar3 = 0;
                  if (pPager->journalOff < local_38) {
                    iVar3 = (*pPager->jfd->pMethods->xTruncate)(pPager->jfd,pPager->journalOff);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int writeSuperJournal(Pager *pPager, const char *zSuper){
  int rc;                          /* Return code */
  int nSuper;                      /* Length of string zSuper */
  i64 iHdrOff;                     /* Offset of header in journal file */
  i64 jrnlSize;                    /* Size of journal file on disk */
  u32 cksum = 0;                   /* Checksum of string zSuper */

  assert( pPager->setSuper==0 );
  assert( !pagerUseWal(pPager) );

  if( !zSuper
   || pPager->journalMode==PAGER_JOURNALMODE_MEMORY
   || !isOpen(pPager->jfd)
  ){
    return SQLITE_OK;
  }
  pPager->setSuper = 1;
  assert( pPager->journalHdr <= pPager->journalOff );

  /* Calculate the length in bytes and the checksum of zSuper */
  for(nSuper=0; zSuper[nSuper]; nSuper++){
    cksum += zSuper[nSuper];
  }

  /* If in full-sync mode, advance to the next disk sector before writing
  ** the super-journal name. This is in case the previous page written to
  ** the journal has already been synced.
  */
  if( pPager->fullSync ){
    pPager->journalOff = journalHdrOffset(pPager);
  }
  iHdrOff = pPager->journalOff;

  /* Write the super-journal data to the end of the journal file. If
  ** an error occurs, return the error code to the caller.
  */
  if( (0 != (rc = write32bits(pPager->jfd, iHdrOff, PAGER_SJ_PGNO(pPager))))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, zSuper, nSuper, iHdrOff+4)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nSuper, nSuper)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nSuper+4, cksum)))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, aJournalMagic, 8,
                                 iHdrOff+4+nSuper+8)))
  ){
    return rc;
  }
  pPager->journalOff += (nSuper+20);

  /* If the pager is in peristent-journal mode, then the physical
  ** journal-file may extend past the end of the super-journal name
  ** and 8 bytes of magic data just written to the file. This is
  ** dangerous because the code to rollback a hot-journal file
  ** will not be able to find the super-journal name to determine
  ** whether or not the journal is hot.
  **
  ** Easiest thing to do in this scenario is to truncate the journal
  ** file to the required size.
  */
  if( SQLITE_OK==(rc = sqlite3OsFileSize(pPager->jfd, &jrnlSize))
   && jrnlSize>pPager->journalOff
  ){
    rc = sqlite3OsTruncate(pPager->jfd, pPager->journalOff);
  }
  return rc;
}